

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::CheckMemoryAccess
          (ValidationState_t *_,Instruction *inst,uint32_t index)

{
  ushort uVar1;
  uint16_t uVar2;
  StorageClass SVar3;
  StorageClass SVar4;
  uint uVar5;
  uint32_t uVar6;
  spv_result_t sVar7;
  Instruction *pIVar8;
  long lVar9;
  size_t index_00;
  char *pcVar10;
  string local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  SVar4 = Max;
  if (uVar1 < 0x1169) {
    if (1 < uVar1 - 0x3f) {
      if (uVar1 == 0x3d) goto LAB_001dfad8;
      if (uVar1 != 0x3e) goto LAB_001dfb75;
      goto LAB_001dfae2;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    pIVar8 = ValidationState_t::FindDef(_,(pIVar8->inst_).type_id);
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(pIVar8,1);
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    pIVar8 = ValidationState_t::FindDef(_,(pIVar8->inst_).type_id);
    SVar4 = Instruction::GetOperandAs<spv::StorageClass>(pIVar8,1);
  }
  else {
    if (uVar1 < 0x14ef) {
      if (uVar1 != 0x1169) {
        if (uVar1 != 0x116a) {
LAB_001dfb75:
          SVar3 = Max;
          goto LAB_001dfb7b;
        }
        goto LAB_001dfae2;
      }
LAB_001dfad8:
      index_00 = 2;
    }
    else {
      if (uVar1 != 0x14f0) {
        if (uVar1 != 0x14ef) goto LAB_001dfb75;
        goto LAB_001dfad8;
      }
LAB_001dfae2:
      index_00 = 0;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,index_00);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    pIVar8 = ValidationState_t::FindDef(_,(pIVar8->inst_).type_id);
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(pIVar8,1);
  }
LAB_001dfb7b:
  if ((ulong)index <
      (ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)index);
    if ((uVar5 & 8) == 0) {
LAB_001dfbab:
      if ((uVar5 & 0x10) == 0) {
        if ((uVar5 & 0x20) != 0) {
LAB_001dfbbb:
          if ((((StorageBuffer < SVar3) || ((0x1934U >> (SVar3 & 0x1f) & 1) == 0)) &&
              (SVar3 != PhysicalStorageBuffer)) ||
             ((((StorageBuffer < SVar4 || ((0x1934U >> (SVar4 & 0x1f) & 1) == 0)) &&
               (SVar4 != PhysicalStorageBuffer)) && (SVar4 != Max)))) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"NonPrivatePointerKHR requires a pointer in Uniform, ",
                       0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer ",0x3b);
            pcVar10 = "storage classes.";
            lVar9 = 0x10;
            goto LAB_001dfe43;
          }
        }
        if ((uVar5 & 2) != 0) {
          return SPV_SUCCESS;
        }
        goto joined_r0x001dfc1f;
      }
      uVar2 = (inst->inst_).opcode;
      if (((uVar2 == 0x3e) || (uVar2 == 0x14f0)) || (uVar2 == 0x116a)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "MakePointerVisibleKHR cannot be used with OpStore.";
        lVar9 = 0x32;
      }
      else {
        if ((uVar5 & 0x20) != 0) {
          uVar6 = GetMakeVisibleScope(inst,uVar5,index);
          sVar7 = ValidateMemoryScope(_,inst,uVar6);
          if (sVar7 != SPV_SUCCESS) {
            return sVar7;
          }
          goto LAB_001dfbbb;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"NonPrivatePointerKHR must be specified if ",0x2a);
        pcVar10 = "MakePointerVisibleKHR is specified.";
        lVar9 = 0x23;
      }
    }
    else {
      uVar2 = (inst->inst_).opcode;
      if (((uVar2 == 0x3d) || (uVar2 == 0x14ef)) || (uVar2 == 0x1169)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "MakePointerAvailableKHR cannot be used with OpLoad.";
        lVar9 = 0x33;
      }
      else {
        if ((uVar5 & 0x20) != 0) {
          uVar6 = GetMakeAvailableScope(inst,uVar5,index);
          sVar7 = ValidateMemoryScope(_,inst,uVar6);
          if (sVar7 != SPV_SUCCESS) {
            return sVar7;
          }
          goto LAB_001dfbab;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar10 = "NonPrivatePointerKHR must be specified if MakePointerAvailableKHR is specified.";
        lVar9 = 0x4f;
      }
    }
LAB_001dfe43:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar10,lVar9);
  }
  else {
joined_r0x001dfc1f:
    if ((SVar3 != PhysicalStorageBuffer) && (SVar4 != PhysicalStorageBuffer)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x1264,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Memory accesses with PhysicalStorageBuffer must use Aligned.",
               0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CheckMemoryAccess(ValidationState_t& _, const Instruction* inst,
                               uint32_t index) {
  spv::StorageClass dst_sc, src_sc;
  std::tie(dst_sc, src_sc) = GetStorageClass(_, inst);
  if (inst->operands().size() <= index) {
    // Cases where lack of some operand is invalid
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
    return SPV_SUCCESS;
  }

  const uint32_t mask = inst->GetOperandAs<uint32_t>(index);
  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
    if (inst->opcode() == spv::Op::OpLoad ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerAvailableKHR cannot be used with OpLoad.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
                "MakePointerAvailableKHR is specified.";
    }

    // Check the associated scope for MakeAvailableKHR.
    const auto available_scope = GetMakeAvailableScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
    if (inst->opcode() == spv::Op::OpStore ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerVisibleKHR cannot be used with OpStore.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
             << "MakePointerVisibleKHR is specified.";
    }

    // Check the associated scope for MakeVisibleKHR.
    const auto visible_scope = GetMakeVisibleScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR)) {
    if (dst_sc != spv::StorageClass::Uniform &&
        dst_sc != spv::StorageClass::Workgroup &&
        dst_sc != spv::StorageClass::CrossWorkgroup &&
        dst_sc != spv::StorageClass::Generic &&
        dst_sc != spv::StorageClass::Image &&
        dst_sc != spv::StorageClass::StorageBuffer &&
        dst_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
    if (src_sc != spv::StorageClass::Max &&
        src_sc != spv::StorageClass::Uniform &&
        src_sc != spv::StorageClass::Workgroup &&
        src_sc != spv::StorageClass::CrossWorkgroup &&
        src_sc != spv::StorageClass::Generic &&
        src_sc != spv::StorageClass::Image &&
        src_sc != spv::StorageClass::StorageBuffer &&
        src_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
  }

  if (!(mask & uint32_t(spv::MemoryAccessMask::Aligned))) {
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
  }

  return SPV_SUCCESS;
}